

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cleartext.c
# Opt level: O0

CURLcode Curl_auth_create_plain_message(char *authzid,char *authcid,char *passwd,bufref *out)

{
  size_t __n;
  size_t __n_00;
  long lVar1;
  size_t len;
  void *__dest;
  ulong local_60;
  size_t plen;
  size_t clen;
  size_t zlen;
  size_t plainlen;
  char *plainauth;
  bufref *out_local;
  char *passwd_local;
  char *authcid_local;
  char *authzid_local;
  
  if (authzid == (char *)0x0) {
    local_60 = 0;
  }
  else {
    local_60 = strlen(authzid);
  }
  __n = strlen(authcid);
  __n_00 = strlen(passwd);
  if (((local_60 < 0x4000000000000000) && (__n < 0x4000000000000000)) &&
     (__n_00 < 0x7ffffffffffffffe)) {
    lVar1 = local_60 + __n + __n_00;
    len = lVar1 + 2;
    __dest = (*Curl_cmalloc)(lVar1 + 3);
    if (__dest == (void *)0x0) {
      authzid_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      if (local_60 != 0) {
        memcpy(__dest,authzid,local_60);
      }
      *(undefined1 *)((long)__dest + local_60) = 0;
      memcpy((void *)((long)__dest + local_60 + 1),authcid,__n);
      *(undefined1 *)((long)__dest + local_60 + __n + 1) = 0;
      memcpy((void *)((long)__dest + __n + local_60 + 2),passwd,__n_00);
      *(undefined1 *)((long)__dest + len) = 0;
      Curl_bufref_set(out,__dest,len,curl_free);
      authzid_local._4_4_ = CURLE_OK;
    }
  }
  else {
    authzid_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  return authzid_local._4_4_;
}

Assistant:

CURLcode Curl_auth_create_plain_message(const char *authzid,
                                        const char *authcid,
                                        const char *passwd,
                                        struct bufref *out)
{
  char *plainauth;
  size_t plainlen;
  size_t zlen;
  size_t clen;
  size_t plen;

  zlen = (authzid == NULL ? 0 : strlen(authzid));
  clen = strlen(authcid);
  plen = strlen(passwd);

  /* Compute binary message length. Check for overflows. */
  if((zlen > SIZE_T_MAX/4) || (clen > SIZE_T_MAX/4) ||
     (plen > (SIZE_T_MAX/2 - 2)))
    return CURLE_OUT_OF_MEMORY;
  plainlen = zlen + clen + plen + 2;

  plainauth = malloc(plainlen + 1);
  if(!plainauth)
    return CURLE_OUT_OF_MEMORY;

  /* Calculate the reply */
  if(zlen)
    memcpy(plainauth, authzid, zlen);
  plainauth[zlen] = '\0';
  memcpy(plainauth + zlen + 1, authcid, clen);
  plainauth[zlen + clen + 1] = '\0';
  memcpy(plainauth + zlen + clen + 2, passwd, plen);
  plainauth[plainlen] = '\0';
  Curl_bufref_set(out, plainauth, plainlen, curl_free);
  return CURLE_OK;
}